

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplifyMathematicalExpressions.cpp
# Opt level: O1

bool isOperator(string *input)

{
  int iVar1;
  bool bVar2;
  
  if (1 < input->_M_string_length) {
    return false;
  }
  iVar1 = std::__cxx11::string::compare((char *)input);
  if (iVar1 < 1) {
LAB_00147346:
    iVar1 = std::__cxx11::string::compare((char *)input);
    if (0 < iVar1) {
      iVar1 = std::__cxx11::string::compare((char *)input);
      if (iVar1 < 0) goto LAB_00147395;
    }
    iVar1 = std::__cxx11::string::compare((char *)input);
    if (iVar1 < 1) {
      bVar2 = true;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)input);
      bVar2 = -1 < iVar1;
    }
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)input);
    if (-1 < iVar1) goto LAB_00147346;
LAB_00147395:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool isOperator(std::string input){
    if(input.size() > 1){
        return false;
    }
    return (input <= "a" || input >= "z") && (input <= "A" || input >= "Z") && (input <= "0" || input >= "9");
}